

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_shar.c
# Opt level: O1

int archive_write_set_format_shar_dump(archive *_a)

{
  archive_write_set_format_shar(_a);
  *(undefined4 *)_a[1].read_data_offset = 1;
  _a[2].vtable = (archive_vtable_conflict *)archive_write_shar_data_uuencode;
  _a->archive_format = 0x20002;
  _a->archive_format_name = "shar dump";
  return 0;
}

Assistant:

int
archive_write_set_format_shar_dump(struct archive *_a)
{
	struct archive_write *a = (struct archive_write *)_a;
	struct shar *shar;

	archive_write_set_format_shar(&a->archive);
	shar = (struct shar *)a->format_data;
	shar->dump = 1;
	a->format_write_data = archive_write_shar_data_uuencode;
	a->archive.archive_format = ARCHIVE_FORMAT_SHAR_DUMP;
	a->archive.archive_format_name = "shar dump";
	return (ARCHIVE_OK);
}